

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaMan.c
# Opt level: O1

Vec_Int_t * Pla_GenPrimes(int nVars)

{
  Vec_Int_t *p;
  int *piVar1;
  Vec_Bit_t *__ptr;
  uint uVar2;
  uint uVar3;
  uint Entry;
  
  uVar2 = 1 << ((byte)nVars & 0x1f);
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 1000;
  p->nSize = 0;
  piVar1 = (int *)malloc(4000);
  p->pArray = piVar1;
  __ptr = Pla_ManPrimesTable(nVars);
  if (2 < (int)uVar2) {
    uVar3 = __ptr->nSize;
    Entry = 2;
    if ((int)uVar3 < 3) {
      uVar3 = 2;
    }
    do {
      if (uVar3 == Entry) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                      ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
      }
      if (((uint)__ptr->pArray[Entry >> 5] >> (Entry & 0x1f) & 1) != 0) {
        Vec_IntPush(p,Entry);
      }
      Entry = Entry + 1;
    } while (uVar2 != Entry);
  }
  printf("Primes up to 2^%d = %d\n",nVars,(ulong)(uint)p->nSize);
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (int *)0x0;
  }
  if (__ptr != (Vec_Bit_t *)0x0) {
    free(__ptr);
  }
  return p;
}

Assistant:

Vec_Int_t * Pla_GenPrimes( int nVars )
{
    int n, nBits = ( 1 << nVars );
    Vec_Int_t * vPrimes = Vec_IntAlloc( 1000 );
    Vec_Bit_t * vMap = Pla_ManPrimesTable( nVars );
    for ( n = 2; n < nBits; n++ )
        if ( Vec_BitEntry(vMap, n) )
            Vec_IntPush( vPrimes, n );
    printf( "Primes up to 2^%d = %d\n", nVars, Vec_IntSize(vPrimes) );
//    Abc_GenCountHits1( vMap, vPrimes, nVars );
    Vec_BitFree( vMap );
    return vPrimes;
}